

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O2

void __thiscall BBDT<RemSP>::FirstScan(BBDT<RemSP> *this)

{
  char cVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int r;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar10 = (long)*(int *)&pMVar2->field_0x8;
  lVar17 = (long)*(int *)&pMVar2->field_0xc;
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  uVar8 = 0;
  do {
    if (lVar10 <= (long)uVar8) {
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar6 = **(long **)&pMVar2->field_0x48;
    lVar7 = lVar6 * uVar8 + *(long *)&pMVar2->field_0x10;
    lVar15 = lVar7 - lVar6;
    lVar11 = lVar15 - lVar6;
    lVar12 = **(long **)&pMVar3->field_0x48;
    lVar14 = lVar12 * uVar8 + *(long *)&pMVar3->field_0x10;
    lVar6 = lVar6 + lVar7;
    lVar12 = lVar14 + lVar12 * -2;
    uVar13 = uVar8 | 1;
    for (uVar16 = 0; (long)uVar16 < lVar17; uVar16 = uVar16 + 2) {
      if (*(char *)(lVar7 + uVar16) == '\0') {
        if (((long)uVar13 < lVar10) && (*(char *)(lVar6 + uVar16) != '\0')) {
          uVar5 = uVar16 | 1;
          if ((lVar17 <= (long)uVar5) || (*(char *)(lVar7 + uVar5) == '\0')) {
            if ((uVar16 != 0) &&
               ((*(char *)((uVar16 - 1) + lVar6) != '\0' || (*(char *)(lVar7 + -1 + uVar16) != '\0')
                ))) goto LAB_0018a919;
            goto LAB_0018a66a;
          }
          if (uVar16 == 0) {
LAB_0018a362:
            if (uVar8 == 0) goto LAB_0018a66a;
            if (*(char *)(lVar15 + (uVar16 | 1)) == '\0') {
              if (((long)(uVar16 + 2) < lVar17) && (*(char *)(lVar15 + uVar16 + 2) != '\0')) {
                if (*(char *)(lVar15 + uVar16) == '\0') goto LAB_0018a729;
                goto LAB_0018a513;
              }
              if (*(char *)(lVar15 + uVar16) == '\0') goto LAB_0018a66a;
            }
            goto LAB_0018a661;
          }
          if (*(char *)((uVar16 - 1) + lVar7) != '\0') {
            if (uVar8 != 0) {
              if (*(char *)(lVar15 + uVar5) != '\0') goto LAB_0018a297;
              if (((long)(uVar16 + 2) < lVar17) && (*(char *)(lVar15 + uVar16 + 2) != '\0')) {
                if (*(char *)(lVar11 + uVar5) == '\0') {
                  uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
                  goto LAB_0018a8c3;
                }
                if (*(char *)(lVar15 + uVar16) == '\0') goto LAB_0018a3ed;
LAB_0018a7cf:
                uVar4 = *(uint *)(lVar14 + -8 + uVar16 * 4);
LAB_0018a8dc:
                *(uint *)(lVar14 + uVar16 * 4) = uVar4;
                goto LAB_0018a922;
              }
            }
            goto LAB_0018a919;
          }
          if (*(char *)(lVar6 + -1 + uVar16) == '\0') goto LAB_0018a362;
          if (uVar8 == 0) goto LAB_0018a919;
          if (*(char *)(lVar15 + uVar5) != '\0') {
            if (*(char *)((uVar16 - 2) + lVar7) == '\0') {
LAB_0018a8bf:
              uVar4 = *(uint *)(lVar12 + uVar16 * 4);
LAB_0018a8c3:
              uVar4 = RemSP::Merge(uVar4,*(uint *)(lVar14 + -8 + uVar16 * 4));
              goto LAB_0018a8dc;
            }
            if (*(char *)(lVar15 + -1 + uVar16) != '\0') goto LAB_0018a7c3;
            if ((*(char *)(lVar15 + -2 + uVar16) == '\0') ||
               (*(char *)(lVar11 + -1 + uVar16) == '\0')) goto LAB_0018a761;
            if (*(char *)(lVar15 + uVar16) == '\0') {
              cVar1 = *(char *)(lVar11 + uVar16);
              goto joined_r0x0018a913;
            }
LAB_0018a757:
            uVar4 = *(uint *)(lVar14 + -8 + uVar16 * 4);
            goto LAB_0018aad4;
          }
          if ((lVar17 <= (long)(uVar16 + 2)) || (*(char *)(lVar15 + uVar16 + 2) == '\0')) {
            if (*(char *)(lVar15 + uVar16) != '\0') {
              if (*(char *)((uVar16 - 2) + lVar7) != '\0') {
                if (*(char *)(lVar15 + -1 + uVar16) == '\0') goto LAB_0018a747;
                goto LAB_0018a7cf;
              }
              goto LAB_0018a8bf;
            }
            goto LAB_0018a919;
          }
          if (*(char *)(lVar11 + uVar5) != '\0') {
            if ((*(char *)((uVar16 - 2) + lVar7) == '\0') ||
               ((*(char *)(lVar15 + -1 + uVar16) == '\0' &&
                ((*(char *)(lVar15 + -2 + uVar16) == '\0' ||
                 (*(char *)(lVar11 + -1 + uVar16) == '\0')))))) goto LAB_0018aabb;
            if (*(char *)(lVar15 + uVar16) == '\0') {
              cVar1 = *(char *)(lVar11 + uVar16);
              goto joined_r0x0018a86d;
            }
            goto LAB_0018a757;
          }
          if (*(char *)(lVar15 + uVar16) == '\0') goto LAB_0018aa83;
          if (*(char *)((uVar16 - 2) + lVar7) == '\0') {
LAB_0018ab17:
            uVar4 = RemSP::Merge(*(uint *)(lVar12 + uVar16 * 4),*(uint *)(lVar12 + 8 + uVar16 * 4));
            uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
          }
          else {
            if (*(char *)(lVar15 + -1 + uVar16) == '\0') {
              if (*(char *)(lVar15 + -2 + uVar16) != '\0') {
                cVar1 = *(char *)(lVar11 + -1 + uVar16);
                goto joined_r0x0018ab0c;
              }
              goto LAB_0018ab17;
            }
            uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
            uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
          }
          uVar4 = RemSP::Merge(uVar4,uVar9);
          *(uint *)(lVar14 + uVar16 * 4) = uVar4;
        }
        else {
          uVar5 = uVar16 | 1;
          if ((long)uVar5 < lVar17) {
            if (*(char *)(lVar7 + uVar5) != '\0') goto LAB_0018a362;
            if (((long)uVar13 < lVar10) && (*(char *)(lVar6 + uVar5) != '\0')) goto LAB_0018a66a;
          }
          *(undefined4 *)(lVar14 + uVar16 * 4) = 0;
        }
      }
      else {
        if (uVar16 == 0) {
LAB_0018a487:
          uVar5 = uVar16 | 1;
          if ((uVar8 == 0) || ((lVar17 <= (long)uVar5 || (*(char *)(lVar15 + uVar5) == '\0')))) {
            if (((long)uVar5 < lVar17) && (*(char *)(lVar7 + uVar5) != '\0')) {
              if ((uVar8 == 0) || (lVar17 <= (long)(uVar16 + 2))) {
                if (uVar8 == 0) goto LAB_0018a66a;
              }
              else if (*(char *)(lVar15 + uVar16 + 2) != '\0') {
                if (*(char *)(lVar15 + uVar16) == '\0') {
                  if ((uVar16 != 0) && (*(char *)(lVar15 + -1 + uVar16) != '\0')) {
                    if ((*(char *)(lVar11 + uVar5) != '\0') && (*(char *)(lVar11 + uVar16) != '\0'))
                    {
                      uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
                      goto LAB_0018aad4;
                    }
                    uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
                    uVar9 = *(uint *)(lVar12 + 8 + uVar16 * 4);
                    goto LAB_0018aac5;
                  }
                }
                else {
LAB_0018a513:
                  if (*(char *)(lVar11 + (uVar16 | 1)) == '\0') {
                    uVar4 = *(uint *)(lVar12 + uVar16 * 4);
                    uVar9 = *(uint *)(lVar12 + 8 + uVar16 * 4);
                    goto LAB_0018a77b;
                  }
                }
LAB_0018a729:
                uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
                goto LAB_0018a91e;
              }
              if (*(char *)(lVar15 + uVar16) != '\0') goto LAB_0018a661;
              if (uVar8 != 0 && uVar16 != 0) {
LAB_0018a5b3:
                if (*(char *)(lVar15 + -1 + uVar16) != '\0') {
                  uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
                  goto LAB_0018a91e;
                }
              }
            }
            else if (uVar8 != 0) {
              if (*(char *)(lVar15 + uVar16) != '\0') goto LAB_0018a661;
              if (uVar16 != 0) goto LAB_0018a5b3;
            }
LAB_0018a66a:
            RemSP::P_[RemSP::length_] = RemSP::length_;
            uVar4 = RemSP::length_ + 1;
            *(uint *)(lVar14 + uVar16 * 4) = RemSP::length_;
            RemSP::length_ = uVar4;
            goto LAB_0018a922;
          }
          if ((((*(char *)(lVar15 + uVar16) == '\0') && (uVar16 != 0)) &&
              (*(char *)(lVar15 + -1 + uVar16) != '\0')) && (*(char *)(lVar11 + uVar16) == '\0')) {
            uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
            uVar9 = *(uint *)(lVar12 + uVar16 * 4);
            goto LAB_0018a77b;
          }
LAB_0018a661:
          uVar4 = *(uint *)(lVar12 + uVar16 * 4);
        }
        else if (*(char *)(lVar7 + -1 + uVar16) == '\0') {
          if ((lVar10 <= (long)uVar13) || (*(char *)(lVar6 + -1 + uVar16) == '\0'))
          goto LAB_0018a487;
          uVar5 = uVar16 | 1;
          if (((uVar8 == 0) || (lVar17 <= (long)uVar5)) || (*(char *)(lVar15 + uVar5) == '\0')) {
            if (((lVar17 <= (long)uVar5) || (*(char *)(lVar7 + uVar5) == '\0')) ||
               ((uVar8 == 0 ||
                ((lVar17 <= (long)(uVar16 + 2) || (*(char *)(lVar15 + uVar16 + 2) == '\0')))))) {
              if (uVar8 != 0) {
                if (*(char *)(lVar15 + -1 + uVar16) == '\0') {
                  if (*(char *)(lVar15 + uVar16) != '\0') {
                    if (*(char *)((uVar16 - 2) + lVar7) != '\0') {
LAB_0018a747:
                      cVar1 = *(char *)(lVar15 + -2 + uVar16);
                      goto joined_r0x0018a2c0;
                    }
                    goto LAB_0018a772;
                  }
                }
                else if (*(char *)((uVar16 - 2) + lVar7) == '\0') {
                  uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
                  goto LAB_0018a776;
                }
              }
              goto LAB_0018a919;
            }
            if (*(char *)((uVar16 - 2) + lVar7) != '\0') {
              if (*(char *)(lVar15 + -1 + uVar16) == '\0') {
                if (*(char *)(lVar11 + uVar5) != '\0') {
                  if ((*(char *)(lVar15 + -2 + uVar16) == '\0') ||
                     (*(char *)(lVar11 + -1 + uVar16) == '\0')) {
                    uVar4 = RemSP::Merge(*(uint *)(lVar12 + 8 + uVar16 * 4),
                                         *(uint *)(lVar14 + -8 + uVar16 * 4));
                  }
                  else {
                    if (*(char *)(lVar15 + uVar16) == '\0') {
                      cVar1 = *(char *)(lVar11 + uVar16);
                      goto joined_r0x0018a86d;
                    }
                    uVar4 = *(uint *)(lVar14 + -8 + uVar16 * 4);
                  }
                  *(uint *)(lVar14 + uVar16 * 4) = uVar4;
                  goto LAB_0018a922;
                }
                if (*(char *)(lVar15 + uVar16) != '\0') {
                  if (*(char *)(lVar15 + -2 + uVar16) == '\0') {
                    uVar4 = *(uint *)(lVar12 + uVar16 * 4);
                    goto LAB_0018aa91;
                  }
                  cVar1 = *(char *)(lVar11 + -1 + uVar16);
                  goto joined_r0x0018ab0c;
                }
              }
              else if (*(char *)(lVar11 + uVar5) != '\0') {
                if (*(char *)(lVar15 + uVar16) == '\0') {
                  cVar1 = *(char *)(lVar11 + uVar16);
joined_r0x0018a86d:
                  if (cVar1 == '\0') goto LAB_0018aa83;
                }
                goto LAB_0018a919;
              }
LAB_0018aa83:
              uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
              goto LAB_0018a776;
            }
            if (*(char *)(lVar15 + uVar16) != '\0') {
              cVar1 = *(char *)(lVar11 + uVar5);
joined_r0x0018ab0c:
              if (cVar1 != '\0') {
LAB_0018a88f:
                uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
                goto LAB_0018a894;
              }
              uVar4 = *(uint *)(lVar12 + uVar16 * 4);
LAB_0018a9fd:
              uVar9 = *(uint *)(lVar12 + 8 + uVar16 * 4);
              goto LAB_0018aa02;
            }
            if (*(char *)(lVar15 + -1 + uVar16) == '\0') goto LAB_0018aa83;
            if (*(char *)(lVar11 + uVar5) != '\0') {
              if (*(char *)(lVar11 + uVar16) != '\0') goto LAB_0018a88f;
              uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
              goto LAB_0018a9fd;
            }
            uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
LAB_0018aa91:
            uVar4 = RemSP::Merge(uVar4,*(uint *)(lVar12 + 8 + uVar16 * 4));
            uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
          }
          else {
            if (*(char *)((uVar16 - 2) + lVar7) == '\0') {
              if ((*(char *)(lVar15 + uVar16) == '\0') && (*(char *)(lVar15 + -1 + uVar16) != '\0'))
              {
                if (*(char *)(lVar11 + uVar16) == '\0') {
                  uVar4 = *(uint *)(lVar12 + -8 + uVar16 * 4);
                  uVar9 = *(uint *)(lVar12 + uVar16 * 4);
LAB_0018aa02:
                  uVar4 = RemSP::Merge(uVar4,uVar9);
                  uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
                }
                else {
                  uVar4 = *(uint *)(lVar12 + uVar16 * 4);
LAB_0018a894:
                  uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
                }
                uVar4 = RemSP::Merge(uVar4,uVar9);
                *(uint *)(lVar14 + uVar16 * 4) = uVar4;
                goto LAB_0018a922;
              }
            }
            else {
              if (*(char *)(lVar15 + -1 + uVar16) == '\0') {
                if ((*(char *)(lVar15 + -2 + uVar16) == '\0') ||
                   (*(char *)(lVar11 + -1 + uVar16) == '\0')) goto LAB_0018a8bf;
LAB_0018a7c3:
                if (*(char *)(lVar15 + uVar16) != '\0') goto LAB_0018a7cf;
                cVar1 = *(char *)(lVar11 + uVar16);
              }
              else {
                if (*(char *)(lVar15 + uVar16) != '\0') goto LAB_0018a919;
                cVar1 = *(char *)(lVar11 + uVar16);
              }
joined_r0x0018a913:
              if (cVar1 != '\0') goto LAB_0018a919;
            }
LAB_0018a772:
            uVar4 = *(uint *)(lVar12 + uVar16 * 4);
LAB_0018a776:
            uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
          }
LAB_0018a77b:
          uVar4 = RemSP::Merge(uVar4,uVar9);
        }
        else {
          uVar5 = uVar16 | 1;
          if (((uVar8 == 0) || (lVar17 <= (long)uVar5)) || (*(char *)(lVar15 + uVar5) == '\0')) {
            if ((((long)uVar5 < lVar17) && (*(char *)(lVar7 + uVar5) != '\0')) &&
               ((uVar8 != 0 &&
                (((long)(uVar16 + 2) < lVar17 && (*(char *)(lVar15 + uVar16 + 2) != '\0')))))) {
              if (*(char *)(lVar11 + uVar5) != '\0') {
                if (*(char *)(lVar15 + uVar16) != '\0') goto LAB_0018a757;
LAB_0018a3ed:
                if ((*(char *)(lVar11 + uVar16) != '\0') &&
                   ((*(char *)(lVar15 + -1 + uVar16) != '\0' ||
                    ((*(char *)((uVar16 - 2) + lVar15) != '\0' &&
                     (*(char *)(lVar11 + -1 + uVar16) != '\0')))))) goto LAB_0018a757;
              }
LAB_0018aabb:
              uVar4 = *(uint *)(lVar12 + 8 + uVar16 * 4);
              goto LAB_0018aac0;
            }
          }
          else {
LAB_0018a297:
            if (*(char *)(lVar15 + uVar16) == '\0') {
              if (*(char *)(lVar11 + uVar16) != '\0') {
                if (*(char *)(lVar15 + -1 + uVar16) != '\0') goto LAB_0018a757;
                cVar1 = *(char *)((uVar16 - 2) + lVar15);
joined_r0x0018a2c0:
                if ((cVar1 != '\0') && (*(char *)(lVar11 + -1 + uVar16) != '\0')) goto LAB_0018a757;
              }
LAB_0018a761:
              uVar4 = *(uint *)(lVar12 + uVar16 * 4);
LAB_0018aac0:
              uVar9 = *(uint *)(lVar14 + -8 + uVar16 * 4);
LAB_0018aac5:
              uVar4 = RemSP::Merge(uVar4,uVar9);
LAB_0018aad4:
              *(uint *)(lVar14 + uVar16 * 4) = uVar4;
              goto LAB_0018a922;
            }
          }
LAB_0018a919:
          uVar4 = *(uint *)(lVar14 + -8 + uVar16 * 4);
        }
LAB_0018a91e:
        *(uint *)(lVar14 + uVar16 * 4) = uVar4;
      }
LAB_0018a922:
    }
    uVar8 = uVar8 + 2;
  } while( true );
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }